

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

void google::protobuf::internal::arena_delete_object<std::__cxx11::string>(void *object)

{
  if (object != (void *)0x0) {
    if (*object != (long *)((long)object + 0x10)) {
      operator_delete(*object,*(long *)((long)object + 0x10) + 1);
    }
    operator_delete(object,0x20);
    return;
  }
  return;
}

Assistant:

void arena_delete_object(void* PROTOBUF_NONNULL object) {
  delete reinterpret_cast<T*>(object);
}